

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O3

int ddSymmGroupMove(DdManager *table,int x,int y,Move **moves)

{
  uint uVar1;
  int iVar2;
  DdHalfWord DVar3;
  DdSubtable *pDVar4;
  DdNode *pDVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  DdHalfWord y_00;
  DdHalfWord x_00;
  uint uVar10;
  int iVar11;
  int iVar12;
  DdHalfWord DVar13;
  int iVar14;
  bool bVar15;
  
  pDVar4 = table->subtables;
  uVar1 = pDVar4[x].next;
  uVar7 = y;
  do {
    uVar10 = uVar7;
    uVar7 = pDVar4[(int)uVar10].next;
  } while (uVar10 < pDVar4[(int)uVar10].next);
  iVar11 = x - uVar1;
  iVar6 = uVar10 - y;
  uVar7 = uVar1;
  if (iVar6 < 0) {
    y_00 = 0xffffffff;
    x_00 = 0xffffffff;
    iVar2 = -1;
  }
  else {
    y_00 = 0xffffffff;
    x_00 = 0xffffffff;
    iVar2 = -1;
    DVar3 = x;
    DVar13 = y;
    iVar12 = 1;
    do {
      iVar14 = iVar11 + 1;
      if (-1 < iVar11) {
        do {
          y_00 = DVar13;
          x_00 = DVar3;
          iVar2 = cuddSwapInPlace(table,x_00,y_00);
          if (iVar2 == 0) goto LAB_007ee37a;
          iVar14 = iVar14 + -1;
          DVar3 = x_00 - 1;
          DVar13 = x_00;
        } while (iVar14 != 0);
      }
      DVar13 = iVar12 + y;
      DVar3 = (iVar12 + y) - 1;
      bVar15 = iVar12 != (uVar10 - y) + 1;
      iVar12 = iVar12 + 1;
    } while (bVar15);
    pDVar4 = table->subtables;
    if (uVar10 != y) {
      puVar9 = &pDVar4[(int)uVar1].next;
      do {
        uVar7 = uVar7 + 1;
        *puVar9 = uVar7;
        puVar9 = puVar9 + 0xe;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
  }
  pDVar4[(int)uVar7].next = uVar1;
  uVar8 = uVar7 + 1;
  uVar10 = uVar8;
  if (0 < iVar11) {
    puVar9 = &pDVar4[(int)uVar8].next;
    uVar7 = uVar7 + 2;
    iVar6 = 0;
    do {
      *puVar9 = uVar7;
      puVar9 = puVar9 + 0xe;
      iVar6 = iVar6 + -1;
      uVar7 = uVar7 + 1;
    } while (uVar1 - x != iVar6);
    uVar10 = uVar8 - iVar6;
  }
  pDVar4[(int)uVar10].next = uVar8;
  pDVar5 = cuddDynamicAllocNode(table);
  if (pDVar5 == (DdNode *)0x0) {
LAB_007ee37a:
    iVar2 = 0;
  }
  else {
    pDVar5->index = x_00;
    pDVar5->ref = y_00;
    *(int *)((long)&pDVar5->next + 4) = iVar2;
    (pDVar5->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar5;
  }
  return iVar2;
}

Assistant:

static int
ddSymmGroupMove(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move *move;
    int  size = -1;
    int  i,j;
    int  xtop,xbot,xsize,ytop,ybot,ysize,newxtop;
    int  swapx = -1,swapy = -1;

#ifdef DD_DEBUG
    assert(x < y);      /* we assume that x < y */
#endif
    /* Find top, bottom, and size for the two groups. */
    xbot = x;
    xtop = table->subtables[x].next;
    xsize = xbot - xtop + 1;
    ybot = y;
    while ((unsigned) ybot < table->subtables[ybot].next)
        ybot = table->subtables[ybot].next;
    ytop = y;
    ysize = ybot - ytop + 1;

    /* Sift the variables of the second group up through the first group. */
    for (i = 1; i <= ysize; i++) {
        for (j = 1; j <= xsize; j++) {
            size = cuddSwapInPlace(table,x,y);
            if (size == 0) return(0);
            swapx = x; swapy = y;
            y = x;
            x = y - 1;
        }
        y = ytop + i;
        x = y - 1;
    }

    /* fix symmetries */
    y = xtop; /* ytop is now where xtop used to be */
    for (i = 0; i < ysize-1 ; i++) {
        table->subtables[y].next = y + 1;
        y = y + 1;
    }
    table->subtables[y].next = xtop; /* y is bottom of its group, join */
                                     /* its symmetry to top of its group */
    x = y + 1;
    newxtop = x;
    for (i = 0; i < xsize - 1 ; i++) {
        table->subtables[x].next = x + 1;
        x = x + 1;
    }
    table->subtables[x].next = newxtop; /* x is bottom of its group, join */
                                        /* its symmetry to top of its group */
    /* Store group move */
    move = (Move *) cuddDynamicAllocNode(table);
    if (move == NULL) return(0);
    move->x = swapx;
    move->y = swapy;
    move->size = size;
    move->next = *moves;
    *moves = move;

    return(size);

}